

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O0

boolean lib_dlb_init(void)

{
  boolean bVar1;
  
  memset(dlb_libs,0,0xe0);
  bVar1 = open_library("nhdat",dlb_libs);
  return bVar1 != '\0';
}

Assistant:

static boolean lib_dlb_init(void)
{
    /* zero out array */
    memset((char *)&dlb_libs[0], 0, sizeof(dlb_libs));

    /* To open more than one library, add open library calls here. */
    if (!open_library(DLBFILE, &dlb_libs[0])) return FALSE;
#ifdef DLBFILE2
    if (!open_library(DLBFILE2, &dlb_libs[1]))  {
	close_library(&dlb_libs[0]);
	return FALSE;
    }
#endif
    return TRUE;
}